

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::AttachmentPromiseNode<kj::String>::~AttachmentPromiseNode
          (AttachmentPromiseNode<kj::String> *this)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  PromiseNode *pPVar4;
  Disposer *pDVar5;
  
  AttachmentPromiseNodeBase::dropDependency(&this->super_AttachmentPromiseNodeBase);
  pcVar1 = (this->attachment).content.ptr;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (this->attachment).content.size_;
    (this->attachment).content.ptr = (char *)0x0;
    (this->attachment).content.size_ = 0;
    pAVar3 = (this->attachment).content.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  (this->super_AttachmentPromiseNodeBase).super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&PTR_onReady_00448958;
  pPVar4 = (this->super_AttachmentPromiseNodeBase).dependency.ptr;
  if (pPVar4 != (PromiseNode *)0x0) {
    (this->super_AttachmentPromiseNodeBase).dependency.ptr = (PromiseNode *)0x0;
    pDVar5 = (this->super_AttachmentPromiseNodeBase).dependency.disposer;
    (**pDVar5->_vptr_Disposer)
              (pDVar5,pPVar4->_vptr_PromiseNode[-2] + (long)&pPVar4->_vptr_PromiseNode);
    return;
  }
  return;
}

Assistant:

~AttachmentPromiseNode() noexcept(false) {
    // We need to make sure the dependency is deleted before we delete the attachment because the
    // dependency may be using the attachment.
    dropDependency();
  }